

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filesystem.cpp
# Opt level: O2

bool validate_any_path(char *path)

{
  char cVar1;
  bool bVar2;
  uint64_t uVar3;
  
  if (path != (char *)0x0) {
    if (*path == '\0') {
      bVar2 = false;
    }
    else {
      uVar3 = test_string_length(path);
      if (uVar3 == 0) {
        cVar1 = '\0';
      }
      else {
        cVar1 = path[uVar3 - 1];
      }
      bVar2 = cVar1 != '\\' && cVar1 != '/';
    }
    return bVar2;
  }
  return false;
}

Assistant:

static bool validate_any_path(const char *path)
{
  if (path == nullptr || *path == '\0')
  {
    return false;
  }

  // This also helps to validate that the string has a null terminator and
  // doesn't run off the end of memory.
  char last = get_last_char(path);
  return last != '/' && last != '\\';
}